

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::SequenceDeclarationSyntax::setChild
          (SequenceDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *pSVar2;
  SyntaxNode *pSVar3;
  logic_error *this_00;
  Token TVar4;
  NamedBlockClauseSyntax *local_188;
  SequenceExprSyntax *local_180;
  AssertionItemPortListSyntax *local_178;
  string local_150;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 local_78;
  Info *local_70;
  undefined8 local_68;
  Info *local_60;
  SequenceExprSyntax *local_58;
  SequenceExprSyntax *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  SequenceDeclarationSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar3 = TokenOrSyntax::node(&child);
    pSVar1 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar3);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=
              (&(this->super_MemberSyntax).attributes,pSVar1);
    break;
  case 1:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar4._0_8_;
    (this->keyword).kind = (undefined2)local_28;
    (this->keyword).field_0x2 = local_28._2_1_;
    (this->keyword).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->keyword).rawLen = local_28._4_4_;
    local_20 = TVar4.info;
    (this->keyword).info = local_20;
    break;
  case 2:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar4._0_8_;
    (this->name).kind = (undefined2)local_38;
    (this->name).field_0x2 = local_38._2_1_;
    (this->name).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->name).rawLen = local_38._4_4_;
    local_30 = TVar4.info;
    (this->name).info = local_30;
    break;
  case 3:
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      local_178 = (AssertionItemPortListSyntax *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
      local_178 = SyntaxNode::as<slang::syntax::AssertionItemPortListSyntax>(pSVar3);
    }
    this->portList = local_178;
    break;
  case 4:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar4._0_8_;
    (this->semi).kind = (undefined2)local_48;
    (this->semi).field_0x2 = local_48._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->semi).rawLen = local_48._4_4_;
    local_40 = TVar4.info;
    (this->semi).info = local_40;
    break;
  case 5:
    pSVar3 = TokenOrSyntax::node(&child);
    pSVar2 = SyntaxNode::
             as<slang::syntax::SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>>(pSVar3);
    SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>::operator=(&this->variables,pSVar2);
    break;
  case 6:
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      local_180 = (SequenceExprSyntax *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
      local_180 = SyntaxNode::as<slang::syntax::SequenceExprSyntax>(pSVar3);
    }
    local_58 = local_180;
    not_null<slang::syntax::SequenceExprSyntax*>::not_null<slang::syntax::SequenceExprSyntax*,void>
              ((not_null<slang::syntax::SequenceExprSyntax*> *)&local_50,&local_58);
    (this->seqExpr).ptr = local_50;
    break;
  case 7:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_68 = TVar4._0_8_;
    (this->optionalSemi).kind = (undefined2)local_68;
    (this->optionalSemi).field_0x2 = local_68._2_1_;
    (this->optionalSemi).numFlags = (NumericTokenFlags)local_68._3_1_;
    (this->optionalSemi).rawLen = local_68._4_4_;
    local_60 = TVar4.info;
    (this->optionalSemi).info = local_60;
    break;
  case 8:
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_78 = TVar4._0_8_;
    (this->end).kind = (undefined2)local_78;
    (this->end).field_0x2 = local_78._2_1_;
    (this->end).numFlags = (NumericTokenFlags)local_78._3_1_;
    (this->end).rawLen = local_78._4_4_;
    local_70 = TVar4.info;
    (this->end).info = local_70;
    break;
  case 9:
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      local_188 = (NamedBlockClauseSyntax *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
      local_188 = SyntaxNode::as<slang::syntax::NamedBlockClauseSyntax>(pSVar3);
    }
    this->endBlockName = local_188;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_119);
    std::operator+(&local_f8,&local_118,":");
    std::__cxx11::to_string(&local_150,0x2d2a);
    std::operator+(&local_d8,&local_f8,&local_150);
    std::operator+(&local_b8,&local_d8,": ");
    std::operator+(&local_98,&local_b8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_98);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void SequenceDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: name = child.token(); return;
        case 3: portList = child.node() ? &child.node()->as<AssertionItemPortListSyntax>() : nullptr; return;
        case 4: semi = child.token(); return;
        case 5: variables = child.node()->as<SyntaxList<LocalVariableDeclarationSyntax>>(); return;
        case 6: seqExpr = child.node() ? &child.node()->as<SequenceExprSyntax>() : nullptr; return;
        case 7: optionalSemi = child.token(); return;
        case 8: end = child.token(); return;
        case 9: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}